

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

int __thiscall
MatroskaDemuxer::ebml_read_binary(MatroskaDemuxer *this,uint32_t *id,uint8_t **binary,int *size)

{
  int iVar1;
  uint uVar2;
  uint8_t *binary_00;
  ostream *poVar3;
  undefined4 *puVar4;
  uint *local_1c0;
  undefined8 local_1b8;
  uint local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  int64_t rlength;
  ostringstream ss;
  
  iVar1 = ebml_read_element_id(this,id,(int *)0x0);
  if (-1 < iVar1) {
    iVar1 = ebml_read_element_length(this,&rlength);
    if (-1 < iVar1) {
      *size = (uint)rlength;
      binary_00 = (uint8_t *)operator_new__((long)(int)(uint)rlength);
      *binary = binary_00;
      uVar2 = IOContextDemuxer::get_buffer(&this->super_IOContextDemuxer,binary_00,(uint)rlength);
      iVar1 = 0;
      if (uVar2 != *size) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar3 = std::operator<<((ostream *)&ss,"Matroska parser: read error at pos ");
        std::ostream::_M_insert<long>((long)poVar3);
        puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar4 = 900;
        *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
        if (local_1c0 == &local_1b0) {
          puVar4[6] = local_1b0;
          puVar4[7] = uStack_1ac;
          puVar4[8] = uStack_1a8;
          puVar4[9] = uStack_1a4;
        }
        else {
          *(uint **)(puVar4 + 2) = local_1c0;
          *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1ac,local_1b0);
        }
        *(undefined8 *)(puVar4 + 4) = local_1b8;
        local_1b0 = local_1b0 & 0xffffff00;
        __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
    }
  }
  return iVar1;
}

Assistant:

int MatroskaDemuxer::ebml_read_binary(uint32_t *id, uint8_t **binary, int *size)
{
    int64_t rlength;
    int res;

    if ((res = ebml_read_element_id(id, nullptr)) < 0 || (res = ebml_read_element_length(&rlength)) < 0)
        return res;
    *size = static_cast<int>(rlength);

    *binary = new uint8_t[*size];
    if (!(*binary))
    {
        THROW(ERR_COMMON_MEMORY, "Memory allocation error")
    }

    if (static_cast<int>(get_buffer(*binary, *size)) != *size)
    {
        THROW(ERR_MATROSKA_PARSE, "Matroska parser: read error at pos " << m_processedBytes)
    }
    return 0;
}